

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCLoader.cpp
# Opt level: O1

aiNode * __thiscall
anon_unknown.dwarf_d4b12f::ProcessSpatialStructure
          (anon_unknown_dwarf_d4b12f *this,aiNode *parent,IfcProduct *el,ConversionData *conv,
          vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
          *collect_openings)

{
  undefined1 *puVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  DB *__n;
  _Base_ptr p_Var14;
  undefined8 *puVar15;
  pointer pLVar16;
  _Base_ptr p_Var17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  _Base_ptr p_Var29;
  _Base_ptr p_Var30;
  _Base_ptr p_Var31;
  _Base_ptr p_Var32;
  undefined4 uVar33;
  _Rb_tree_color _Var34;
  undefined4 uVar35;
  iterator iVar36;
  undefined1 auVar37 [8];
  pointer ppIVar38;
  pointer ppIVar39;
  undefined8 uVar40;
  bool bVar41;
  bool bVar42;
  pointer __p;
  long lVar43;
  undefined8 extraout_RAX;
  long *plVar44;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_> _Var45;
  aiString *paVar46;
  aiMetadataEntry *__s;
  undefined4 *puVar47;
  _Rb_tree_node_base *p_Var48;
  IfcObjectPlacement *place;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_> _Var49;
  IfcSpatialStructureElement *pIVar50;
  IfcElement *pIVar51;
  aiNode *paVar52;
  aiMatrix4x4t<float> *this_00;
  undefined1 *puVar53;
  LazyObject *pLVar54;
  Object *pOVar55;
  IfcObjectDefinition *pIVar56;
  aiNode **ppaVar57;
  IfcProductRepresentation *pIVar58;
  IFC *pIVar59;
  aiNode *paVar60;
  IfcCartesianTransformationOperator *op_00;
  IfcRepresentationMap *pIVar61;
  IfcRepresentation *pIVar62;
  aiNode **__s_00;
  undefined1 *puVar63;
  long *plVar64;
  size_type *psVar65;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_> _Var66;
  _Base_ptr p_Var67;
  uint uVar68;
  iterator __begin3;
  aiString *paVar69;
  pointer pLVar70;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  *this_01;
  size_t __n_00;
  long lVar71;
  double *pdVar72;
  _Base_ptr p_Var73;
  aiMatrix4x4t<double> *paVar74;
  bool bVar75;
  const_iterator it;
  const_iterator __position;
  TempOpening *open;
  undefined8 *puVar76;
  TempOpening *pTVar77;
  ulong __n_01;
  TempOpening *op;
  ulong uVar78;
  TempOpening *pTVar79;
  bool bVar80;
  byte bVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  double dVar93;
  double dVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  double dVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  double dVar102;
  float fVar103;
  float fVar104;
  double dVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  double dVar110;
  double dVar111;
  double dVar112;
  pair<std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  pVar113;
  vector<aiNode_*,_std::allocator<aiNode_*>_> subnodes;
  unique_ptr<aiNode,_std::default_delete<aiNode>_> nd;
  vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_> openings_local;
  unique_ptr<aiNode,_std::default_delete<aiNode>_> nd_aggr;
  Metadata properties;
  vector<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*,_std::allocator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*>_>
  repr_ordered;
  vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_> openings;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> meshes;
  aiNode *ndnew;
  _Rb_tree_node_base *local_7d8;
  aiNode *local_7d0;
  double local_7a0;
  double local_798;
  aiNode **local_758;
  iterator iStack_750;
  aiNode **local_748;
  undefined4 local_740;
  allocator local_739;
  DB *local_738;
  aiNode *local_730;
  element_type *local_728;
  aiNode *local_720;
  _Rb_tree_node_base *local_718;
  Settings *local_710;
  _Base_ptr local_708;
  IfcProject *local_700;
  element_type *local_6f8;
  element_type *local_6f0;
  element_type *local_6e8;
  aiScene *local_6e0;
  IfcProject *local_6d8;
  aiNode *local_6d0;
  aiNode *local_6c8;
  _Rb_tree_node_base *local_6c0;
  undefined1 local_6b8 [16];
  TempOpening TStack_6a8;
  Settings *local_650;
  double dStack_648;
  _Base_ptr local_640;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_630;
  _Rb_tree_node_base *local_610;
  undefined1 local_608 [8];
  undefined1 local_600 [16];
  _Base_ptr p_Stack_5f0;
  _Base_ptr local_5e8;
  pointer local_5e0;
  undefined1 local_5d8 [16];
  IfcProject *pIStack_5c8;
  _Rb_tree_node_base *p_Stack_5c0;
  _Rb_tree_node_base *p_Stack_5b8;
  _Base_ptr local_5b0;
  _Base_ptr local_5a8;
  _Rb_tree_node_base *p_Stack_5a0;
  _Base_ptr local_598;
  _Base_ptr p_Stack_590;
  _Base_ptr local_588;
  double local_580;
  Settings *pSStack_578;
  vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_> *local_570;
  vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_> *pvStack_568;
  double local_560;
  ulong local_558;
  _Base_ptr local_550;
  _Base_ptr local_548;
  vector<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*,_std::allocator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*>_>
  local_540;
  long *local_528;
  long local_520;
  long local_518;
  long lStack_510;
  vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_> local_508;
  ConversionData *local_4f0;
  double local_4e8;
  double dStack_4e0;
  double local_4d8;
  double dStack_4d0;
  element_type *local_4c8;
  double dStack_4c0;
  double local_4b8;
  double dStack_4b0;
  DB *local_4a8;
  IfcProject *pIStack_4a0;
  aiScene *local_498;
  element_type *peStack_490;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_488;
  undefined1 *local_458 [2];
  undefined1 local_448 [16];
  undefined1 local_438 [24];
  aiScene *local_420;
  element_type *peStack_418;
  element_type *local_410;
  element_type *local_408;
  double dStack_400;
  double local_3f8;
  double dStack_3f0;
  double local_3e8;
  double local_3e0;
  double dStack_3d8;
  double local_3d0;
  double dStack_3c8;
  double local_3c0;
  
  bVar81 = 0;
  lVar71 = *(long *)&(el->super_IfcObject).field_0x18;
  if ((**(char **)&el[1].super_IfcObject.field_0x28 == '\x01') &&
     (lVar43 = __dynamic_cast((parent->mName).data + *(long *)(*(long *)&parent->mName + -0x18) + -4
                              ,&Assimp::STEP::Object::typeinfo,
                              &Assimp::IFC::Schema_2x3::IfcSpace::typeinfo,0xffffffffffffffff),
     lVar43 != 0)) {
    Assimp::LogFunctions<Assimp::IFCImporter>::LogDebug((char *)0x4bdb34);
    local_740 = (undefined4)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
  }
  else {
    local_740 = 0;
  }
  if ((*(char *)(*(long *)&el[1].super_IfcObject.field_0x28 + 2) == '\x01') &&
     (lVar43 = __dynamic_cast((parent->mName).data + *(long *)(*(long *)&parent->mName + -0x18) + -4
                              ,&Assimp::STEP::Object::typeinfo,
                              &Assimp::IFC::Schema_2x3::IfcAnnotation::typeinfo,0xffffffffffffffff),
     lVar43 != 0)) {
    Assimp::LogFunctions<Assimp::IFCImporter>::LogDebug((char *)0x4bdb8d);
    local_7d0 = (aiNode *)0x0;
  }
  else {
    local_7d0 = (aiNode *)operator_new(0x478);
    aiNode::aiNode(local_7d0);
    std::__cxx11::string::string
              ((string *)&local_488,
               *(char **)((parent->mName).data + *(long *)(*(long *)&parent->mName + -0x18) + 0xc),
               (allocator *)&local_630);
    plVar44 = (long *)std::__cxx11::string::append((char *)&local_488);
    paVar60 = (aiNode *)(plVar44 + 2);
    if ((aiNode *)*plVar44 == paVar60) {
      local_600._8_8_ = *(undefined8 *)&paVar60->mName;
      p_Stack_5f0 = (_Base_ptr)plVar44[3];
      local_608 = (undefined1  [8])(local_600 + 8);
    }
    else {
      local_600._8_8_ = *(undefined8 *)&paVar60->mName;
      local_608 = (undefined1  [8])*plVar44;
    }
    local_600._0_8_ = plVar44[1];
    *plVar44 = (long)paVar60;
    plVar44[1] = 0;
    *(undefined1 *)(plVar44 + 2) = 0;
    if ((parent->mName).data[0x54] == '\x01') {
      local_630._M_dataplus._M_p = (pointer)&local_630.field_2;
      lVar43 = *(long *)((parent->mName).data + 0x34);
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_630,lVar43,*(long *)((parent->mName).data + 0x3c) + lVar43);
    }
    else {
      local_630._M_dataplus._M_p = (pointer)&local_630.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_630,"Unnamed","");
    }
    local_4f0 = conv;
    plVar44 = (long *)std::__cxx11::string::_M_append(local_608,(ulong)local_630._M_dataplus._M_p);
    local_6b8._0_8_ = &TStack_6a8;
    pTVar77 = (TempOpening *)(plVar44 + 2);
    if ((TempOpening *)*plVar44 == pTVar77) {
      TStack_6a8.solid = pTVar77->solid;
      TStack_6a8.extrusionDir.x = (double)plVar44[3];
    }
    else {
      TStack_6a8.solid = pTVar77->solid;
      local_6b8._0_8_ = (TempOpening *)*plVar44;
    }
    local_6b8._8_8_ = plVar44[1];
    *plVar44 = (long)pTVar77;
    plVar44[1] = 0;
    *(undefined1 *)(plVar44 + 2) = 0;
    plVar44 = (long *)std::__cxx11::string::append(local_6b8);
    paVar60 = (aiNode *)(plVar44 + 2);
    if ((aiNode *)*plVar44 == paVar60) {
      pIStack_5c8 = *(IfcProject **)&paVar60->mName;
      p_Stack_5c0 = (_Rb_tree_node_base *)plVar44[3];
      local_5d8._0_8_ = (aiNode *)&pIStack_5c8;
    }
    else {
      pIStack_5c8 = *(IfcProject **)&paVar60->mName;
      local_5d8._0_8_ = (aiNode *)*plVar44;
    }
    local_5d8._8_8_ = plVar44[1];
    *plVar44 = (long)paVar60;
    plVar44[1] = 0;
    *(undefined1 *)(plVar44 + 2) = 0;
    plVar44 = (long *)std::__cxx11::string::_M_append
                                (local_5d8,*(ulong *)((parent->mName).data + 0xc));
    paVar60 = (aiNode *)(plVar44 + 2);
    if ((aiNode *)*plVar44 == paVar60) {
      local_438._16_8_ = *(undefined8 *)&paVar60->mName;
      local_420 = (aiScene *)plVar44[3];
      local_438._0_8_ = (aiNode *)(local_438 + 0x10);
    }
    else {
      local_438._16_8_ = *(undefined8 *)&paVar60->mName;
      local_438._0_8_ = (aiNode *)*plVar44;
    }
    __n = (DB *)plVar44[1];
    *plVar44 = (long)paVar60;
    plVar44[1] = 0;
    *(undefined1 *)(plVar44 + 2) = 0;
    local_438._8_8_ = __n;
    if (__n < (DB *)&DAT_00000400) {
      (local_7d0->mName).length = (ai_uint32)__n;
      memcpy((local_7d0->mName).data,(void *)local_438._0_8_,(size_t)__n);
      (local_7d0->mName).data[(long)__n] = '\0';
    }
    if ((aiNode *)local_438._0_8_ != (aiNode *)(local_438 + 0x10)) {
      operator_delete((void *)local_438._0_8_);
    }
    if ((aiNode *)local_5d8._0_8_ != (aiNode *)&pIStack_5c8) {
      operator_delete((void *)local_5d8._0_8_);
    }
    if ((TempOpening *)local_6b8._0_8_ != &TStack_6a8) {
      operator_delete((void *)local_6b8._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_630._M_dataplus._M_p != &local_630.field_2) {
      operator_delete(local_630._M_dataplus._M_p);
    }
    if (local_608 != (undefined1  [8])(local_600 + 8)) {
      operator_delete((void *)local_608);
    }
    this_01 = (_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
               *)(lVar71 + 0xc0);
    if ((_Base_ptr *)local_488._M_impl._0_8_ !=
        &local_488._M_impl.super__Rb_tree_header._M_header._M_parent) {
      operator_delete((void *)local_488._M_impl._0_8_);
    }
    local_7d0->mParent = (aiNode *)this;
    local_548 = (_Base_ptr)&el[1].super_IfcObject.field_0x40;
    local_438._0_8_ =
         *(undefined8 *)((parent->mName).data + *(long *)(*(long *)&parent->mName + -0x18) + 4);
    std::
    _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
    ::_M_insert_unique<unsigned_long>
              ((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                *)local_548,(unsigned_long *)local_438);
    local_438._0_8_ =
         *(undefined8 *)((parent->mName).data + *(long *)(*(long *)&parent->mName + -0x18) + 4);
    pVar113 = std::
              _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
              ::equal_range(this_01,(key_type_conflict1 *)local_438);
    _Var45 = pVar113.first._M_node;
    if (_Var45._M_node != (_Rb_tree_node_base *)(lVar71 + 200)) {
      p_Stack_5c0 = (_Rb_tree_node_base *)(local_5d8 + 8);
      local_5d8._8_8_ = local_5d8._8_8_ & 0xffffffff00000000;
      pIStack_5c8 = (IfcProject *)0x0;
      local_5b0 = (_Base_ptr)0x0;
      p_Stack_5b8 = p_Stack_5c0;
      if (_Var45._M_node == pVar113.second._M_node._M_node) {
        ProcessMetadata((uint64_t)_Var45._M_node[1]._M_parent,(ConversionData *)el,
                        (Metadata *)local_5d8);
      }
      else {
        do {
          ProcessMetadata((uint64_t)_Var45._M_node[1]._M_parent,(ConversionData *)el,
                          (Metadata *)local_5d8);
          _Var45._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var45._M_node);
        } while (_Var45._M_node != pVar113.second._M_node._M_node);
      }
      p_Var14 = local_5b0;
      if (local_5b0 != (_Base_ptr)0x0) {
        uVar68 = (uint)local_5b0;
        if (uVar68 == 0) {
          local_7d8 = (_Rb_tree_node_base *)0x0;
        }
        else {
          local_7d8 = (_Rb_tree_node_base *)operator_new(0x18);
          ((aiMetadata *)local_7d8)->mKeys = (aiString *)0x0;
          ((aiMetadata *)local_7d8)->mValues = (aiMetadataEntry *)0x0;
          ((aiMetadata *)local_7d8)->mNumProperties = uVar68;
          paVar46 = (aiString *)operator_new__(((ulong)p_Var14 & 0xffffffff) * 0x404);
          paVar69 = paVar46;
          do {
            paVar69->length = 0;
            paVar69->data[0] = '\0';
            memset(paVar69->data + 1,0x1b,0x3ff);
            paVar69 = paVar69 + 1;
          } while (paVar69 != paVar46 + ((ulong)p_Var14 & 0xffffffff));
          ((aiMetadata *)local_7d8)->mKeys = paVar46;
          uVar78 = (ulong)((aiMetadata *)local_7d8)->mNumProperties << 4;
          __s = (aiMetadataEntry *)operator_new__(uVar78);
          memset(__s,0,uVar78);
          ((aiMetadata *)local_7d8)->mValues = __s;
        }
        if (p_Stack_5c0 != (_Rb_tree_node_base *)(local_5d8 + 8)) {
          uVar68 = 0;
          p_Var48 = p_Stack_5c0;
          do {
            __n_00 = (ulong)p_Var48[2]._M_parent & 0xffffffff;
            if (((ulong)p_Var48[2]._M_parent & 0xfffffc00) != 0) {
              __n_00 = 0x3ff;
            }
            local_438._0_4_ = (uint)__n_00;
            memcpy(local_438 + 4,*(void **)(p_Var48 + 2),__n_00);
            local_438[__n_00 + 4] = 0;
            if ((uVar68 < local_7d8->_M_color) &&
               (p_Var14 = p_Var48[1]._M_parent, p_Var14 != (_Base_ptr)0x0)) {
              if (p_Var14 < (_Base_ptr)&DAT_00000400) {
                paVar46 = (aiString *)local_7d8->_M_parent;
                paVar69 = paVar46 + uVar68;
                paVar69->length = (ai_uint32)p_Var14;
                memcpy(paVar69->data,*(void **)(p_Var48 + 1),(size_t)p_Var14);
                (&p_Var14->field_0x4)[(long)(paVar46 + uVar68)] = 0;
              }
              ((aiMetadataEntry *)local_7d8->_M_left)[uVar68].mType = AI_AISTRING;
              puVar47 = (undefined4 *)operator_new(0x404);
              if (0x3fe < (uint)__n_00) {
                __n_00 = 0x3ff;
              }
              *puVar47 = (int)__n_00;
              memcpy(puVar47 + 1,local_438 + 4,__n_00);
              *(undefined1 *)((long)puVar47 + __n_00 + 4) = 0;
              ((aiMetadataEntry *)local_7d8->_M_left)[uVar68].mData = puVar47;
            }
            uVar68 = uVar68 + 1;
            p_Var48 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var48);
          } while (p_Var48 != (_Rb_tree_node_base *)(local_5d8 + 8));
        }
        local_7d0->mMetaData = (aiMetadata *)local_7d8;
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_5d8);
    }
    if ((parent->mName).data[0xe4] == '\x01') {
      place = Assimp::STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcObjectPlacement>
                        (*(LazyObject **)((parent->mName).data + 0xdc));
      ResolveObjectPlacement(&local_7d0->mTransformation,place,(ConversionData *)el);
    }
    local_508.
    super__Vector_base<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_508.
    super__Vector_base<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_508.
    super__Vector_base<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_4a8 = (DB *)0x0;
    pIStack_4a0 = (IfcProject *)0x0;
    local_498 = (aiScene *)0x0;
    peStack_490 = (element_type *)0x0;
    local_4c8 = (element_type *)0x0;
    dStack_4c0 = 0.0;
    local_4b8 = 0.0;
    dStack_4b0 = 0.0;
    local_4e8 = 0.0;
    dStack_4e0 = 0.0;
    local_4d8 = 0.0;
    dStack_4d0 = 0.0;
    local_748 = (aiNode **)0x0;
    local_758 = (aiNode **)0x0;
    iStack_750._M_current = (aiNode **)0x0;
    local_438._0_8_ =
         *(undefined8 *)((parent->mName).data + *(long *)(*(long *)&parent->mName + -0x18) + 4);
    pVar113 = std::
              _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
              ::equal_range(this_01,(key_type_conflict1 *)local_438);
    _Var66 = pVar113.second._M_node;
    local_7d8 = (_Rb_tree_node_base *)pVar113.first._M_node;
    _Var45._M_node = _Var66._M_node;
    if (local_7d8 != _Var66._M_node) {
      puVar1 = &el[1].super_IfcObject.field_0x48;
      local_550 = (_Base_ptr)&local_7d0->mTransformation;
      local_558 = 0;
      local_7a0 = 1.0;
      local_728 = (element_type *)0x3ff0000000000000;
      local_798 = 1.0;
      local_6c8 = (aiNode *)0x3ff0000000000000;
      do {
        _Var45 = pVar113.second._M_node;
        _Var49 = pVar113.first._M_node;
        puVar63 = *(undefined1 **)&el[1].super_IfcObject.field_0x50;
        puVar53 = puVar1;
        if (puVar63 != (undefined1 *)0x0) {
          do {
            bVar80 = *(_Base_ptr *)(puVar63 + 0x20) < _Var49._M_node[1]._M_parent;
            if (!bVar80) {
              puVar53 = puVar63;
            }
            puVar63 = *(undefined1 **)(puVar63 + (ulong)bVar80 * 8 + 0x10);
          } while (puVar63 != (undefined1 *)0x0);
        }
        puVar63 = puVar1;
        if ((puVar53 != puVar1) &&
           (puVar63 = puVar53, _Var49._M_node[1]._M_parent < *(_Base_ptr *)(puVar53 + 0x20))) {
          puVar63 = puVar1;
        }
        if (puVar63 == puVar1) {
          pLVar54 = Assimp::STEP::DB::MustGetObject
                              (*(DB **)&(el->super_IfcObject).field_0x18,
                               (uint64_t)_Var49._M_node[1]._M_parent);
          pOVar55 = Assimp::STEP::LazyObject::operator*(pLVar54);
          lVar71 = __dynamic_cast(pOVar55,&Assimp::STEP::Object::typeinfo,
                                  &Assimp::IFC::Schema_2x3::IfcRelContainedInSpatialStructure::
                                   typeinfo,0xffffffffffffffff);
          if (lVar71 == 0) {
            pOVar55 = Assimp::STEP::LazyObject::operator*(pLVar54);
            lVar71 = __dynamic_cast(pOVar55,&Assimp::STEP::Object::typeinfo,
                                    &Assimp::IFC::Schema_2x3::IfcRelVoidsElement::typeinfo,
                                    0xffffffffffffffff);
            if ((lVar71 != 0) &&
               (pIVar51 = Assimp::STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcElement>
                                    (*(LazyObject **)(lVar71 + 0xb8)),
               *(long *)(&(pIVar51->super_IfcProduct).super_IfcObject.field_0x8 +
                        *(long *)(*(long *)&(pIVar51->super_IfcProduct).super_IfcObject + -0x18)) ==
               *(long *)((parent->mName).data + *(long *)(*(long *)&parent->mName + -0x18) + 4))) {
              paVar60 = (aiNode *)
                        Assimp::STEP::LazyObject::
                        To<Assimp::IFC::Schema_2x3::IfcFeatureElementSubtraction>
                                  (*(LazyObject **)(lVar71 + 0xc0));
              paVar52 = (aiNode *)operator_new(0x478);
              aiNode::aiNode(paVar52);
              (paVar52->mName).length = 0x10;
              builtin_strncpy((paVar52->mName).data,"$RelVoidsElement",0x11);
              paVar52->mParent = local_7d0;
              uVar33 = *(undefined4 *)&local_550->field_0x4;
              p_Var14 = local_550->_M_parent;
              p_Var17 = local_550->_M_left;
              p_Var29 = local_550->_M_right;
              _Var34 = local_550[1]._M_color;
              uVar35 = *(undefined4 *)&local_550[1].field_0x4;
              p_Var30 = local_550[1]._M_parent;
              p_Var31 = local_550[1]._M_left;
              p_Var32 = local_550[1]._M_right;
              (paVar52->mTransformation).a1 = (float)local_550->_M_color;
              (paVar52->mTransformation).a2 = (float)uVar33;
              *(_Base_ptr *)&(paVar52->mTransformation).a3 = p_Var14;
              *(_Base_ptr *)&(paVar52->mTransformation).b1 = p_Var17;
              *(_Base_ptr *)&(paVar52->mTransformation).b3 = p_Var29;
              (paVar52->mTransformation).c1 = (float)_Var34;
              (paVar52->mTransformation).c2 = (float)uVar35;
              *(_Base_ptr *)&(paVar52->mTransformation).c3 = p_Var30;
              *(_Base_ptr *)&(paVar52->mTransformation).d1 = p_Var31;
              *(_Base_ptr *)&(paVar52->mTransformation).d3 = p_Var32;
              local_6b8._0_8_ = (TempOpening *)0x0;
              local_6b8._8_8_ = (TempOpening *)0x0;
              TStack_6a8.solid = (IfcSolidModel *)0x0;
              local_608 = (undefined1  [8])paVar52;
              paVar60 = ProcessSpatialStructure
                                  ((anon_unknown_dwarf_d4b12f *)paVar52,paVar60,el,
                                   (ConversionData *)local_6b8,collect_openings);
              auVar37 = local_608;
              if (paVar60 != (aiNode *)0x0) {
                *(uint *)((long)local_608 + 0x450) = 1;
                ppaVar57 = (aiNode **)operator_new__(8);
                *ppaVar57 = (aiNode *)0x0;
                *(aiNode ***)((long)auVar37 + 0x458) = ppaVar57;
                *ppaVar57 = paVar60;
                if (local_6b8._8_8_ != local_6b8._0_8_) {
                  pTVar79 = (TempOpening *)local_6b8._0_8_;
                  pTVar77 = (TempOpening *)local_6b8._8_8_;
                  if ((local_558 & 1) == 0) {
                    local_5d8._0_8_ = *(undefined8 *)local_550;
                    local_5d8._8_8_ = local_550->_M_parent;
                    pIStack_5c8 = (IfcProject *)local_550->_M_left;
                    p_Stack_5c0 = local_550->_M_right;
                    p_Stack_5b8 = *(_Rb_tree_node_base **)(local_550 + 1);
                    local_5b0 = local_550[1]._M_parent;
                    local_5a8 = local_550[1]._M_left;
                    p_Stack_5a0 = local_550[1]._M_right;
                    this_00 = aiMatrix4x4t<float>::Inverse((aiMatrix4x4t<float> *)local_5d8);
                    aiMatrix4x4t::operator_cast_to_aiMatrix4x4t(this_00);
                    local_6c8 = (aiNode *)local_438._0_8_;
                    local_728 = local_410;
                    local_498 = local_420;
                    peStack_490 = peStack_418;
                    local_4a8 = (DB *)local_438._8_8_;
                    pIStack_4a0 = (IfcProject *)local_438._16_8_;
                    local_4c8 = local_408;
                    dStack_4c0 = dStack_400;
                    local_4b8 = local_3f8;
                    dStack_4b0 = dStack_3f0;
                    local_7a0 = local_3e8;
                    local_4e8 = local_3e0;
                    dStack_4e0 = dStack_3d8;
                    local_4d8 = local_3d0;
                    dStack_4d0 = dStack_3c8;
                    local_798 = local_3c0;
                    local_558 = CONCAT71((int7)((ulong)(local_438 + 8) >> 8),1);
                    pTVar79 = (TempOpening *)local_6b8._0_8_;
                    pTVar77 = (TempOpening *)local_6b8._8_8_;
                  }
                  for (; pTVar79 != pTVar77; pTVar79 = pTVar79 + 1) {
                    aiMatrix4x4t::operator_cast_to_aiMatrix4x4t
                              (&(**(aiNode ***)((long)local_608 + 0x458))->mTransformation);
                    local_730 = (aiNode *)
                                ((double)pSStack_578 * (double)local_498 +
                                (double)local_598 * (double)pIStack_4a0 +
                                (double)local_5d8._0_8_ * (double)local_6c8 +
                                (double)p_Stack_5b8 * (double)local_4a8);
                    local_738 = (DB *)((double)local_570 * (double)local_498 +
                                      (double)p_Stack_590 * (double)pIStack_4a0 +
                                      (double)local_5d8._8_8_ * (double)local_6c8 +
                                      (double)local_4a8 * (double)local_5b0);
                    local_700 = pIStack_5c8;
                    local_6d8 = (IfcProject *)
                                ((double)pvStack_568 * (double)local_498 +
                                (double)local_588 * (double)pIStack_4a0 +
                                (double)pIStack_5c8 * (double)local_6c8 +
                                (double)local_4a8 * (double)local_5a8);
                    local_610 = p_Stack_5a0;
                    local_6c0 = p_Stack_5c0;
                    local_6e0 = (aiScene *)
                                ((double)local_498 * local_560 +
                                (double)pIStack_4a0 * local_580 +
                                (double)p_Stack_5c0 * (double)local_6c8 +
                                (double)local_4a8 * (double)p_Stack_5a0);
                    local_718 = p_Stack_5b8;
                    local_720 = (aiNode *)local_5d8._0_8_;
                    local_708 = local_598;
                    local_710 = pSStack_578;
                    local_6e8 = (element_type *)
                                ((double)pSStack_578 * dStack_4c0 +
                                (double)local_598 * (double)local_4c8 +
                                (double)local_5d8._0_8_ * (double)peStack_490 +
                                (double)local_728 * (double)p_Stack_5b8);
                    local_6f0 = (element_type *)
                                ((double)local_570 * dStack_4c0 +
                                (double)p_Stack_590 * (double)local_4c8 +
                                (double)local_5d8._8_8_ * (double)peStack_490 +
                                (double)local_728 * (double)local_5b0);
                    local_6f8 = (element_type *)
                                ((double)pvStack_568 * dStack_4c0 +
                                (double)local_588 * (double)local_4c8 +
                                (double)pIStack_5c8 * (double)peStack_490 +
                                (double)local_728 * (double)local_5a8);
                    dStack_400 = dStack_4c0 * local_560 +
                                 (double)local_4c8 * local_580 +
                                 (double)peStack_490 * (double)p_Stack_5c0 +
                                 (double)local_728 * (double)p_Stack_5a0;
                    local_3f8 = (double)pSStack_578 * local_4e8 +
                                (double)local_598 * local_7a0 +
                                (double)local_5d8._0_8_ * local_4b8 +
                                (double)p_Stack_5b8 * dStack_4b0;
                    dStack_3f0 = (double)local_570 * local_4e8 +
                                 (double)p_Stack_590 * local_7a0 +
                                 (double)local_5d8._8_8_ * local_4b8 +
                                 (double)local_5b0 * dStack_4b0;
                    local_3e8 = (double)pvStack_568 * local_4e8 +
                                (double)local_588 * local_7a0 +
                                (double)pIStack_5c8 * local_4b8 + (double)local_5a8 * dStack_4b0;
                    local_3e0 = local_4e8 * local_560 +
                                local_580 * local_7a0 +
                                local_4b8 * (double)p_Stack_5c0 + dStack_4b0 * (double)p_Stack_5a0;
                    dStack_3d8 = (double)pSStack_578 * local_798 +
                                 (double)local_598 * dStack_4d0 +
                                 (double)local_5d8._0_8_ * dStack_4e0 +
                                 (double)p_Stack_5b8 * local_4d8;
                    local_3d0 = (double)local_570 * local_798 +
                                (double)p_Stack_590 * dStack_4d0 +
                                (double)local_5d8._8_8_ * dStack_4e0 + (double)local_5b0 * local_4d8
                    ;
                    dStack_3c8 = (double)pvStack_568 * local_798 +
                                 (double)local_588 * dStack_4d0 +
                                 (double)pIStack_5c8 * dStack_4e0 + (double)local_5a8 * local_4d8;
                    local_3c0 = local_560 * local_798 +
                                local_580 * dStack_4d0 +
                                (double)p_Stack_5c0 * dStack_4e0 + (double)p_Stack_5a0 * local_4d8;
                    local_438._0_8_ = local_730;
                    local_438._8_8_ = local_738;
                    local_438._16_8_ = local_6d8;
                    local_420 = local_6e0;
                    peStack_418 = local_6e8;
                    local_410 = local_6f0;
                    local_408 = local_6f8;
                    Assimp::IFC::TempOpening::Transform(pTVar79,(IfcMatrix4 *)local_438);
                    std::vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
                    ::push_back(&local_508,pTVar79);
                  }
                }
                local_438._0_8_ = local_608;
                local_608 = (undefined1  [8])0x0;
                if (iStack_750._M_current == local_748) {
                  std::vector<aiNode*,std::allocator<aiNode*>>::_M_realloc_insert<aiNode*>
                            ((vector<aiNode*,std::allocator<aiNode*>> *)&local_758,iStack_750,
                             (aiNode **)local_438);
                }
                else {
                  *iStack_750._M_current = (aiNode *)local_438._0_8_;
                  iStack_750._M_current = iStack_750._M_current + 1;
                }
              }
              std::vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>::
              ~vector((vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_> *
                      )local_6b8);
              auVar37 = local_608;
              _Var45._M_node = _Var66._M_node;
              if (local_608 != (undefined1  [8])0x0) {
                aiNode::~aiNode((aiNode *)local_608);
                operator_delete((void *)auVar37);
              }
            }
          }
          else {
            pIVar50 = Assimp::STEP::LazyObject::
                      To<Assimp::IFC::Schema_2x3::IfcSpatialStructureElement>
                                (*(LazyObject **)(lVar71 + 0xd0));
            if (*(long *)(&(pIVar50->super_IfcProduct).super_IfcObject.field_0x8 +
                         *(long *)(*(long *)&(pIVar50->super_IfcProduct).super_IfcObject + -0x18))
                == *(long *)((parent->mName).data + *(long *)(*(long *)&parent->mName + -0x18) + 4))
            {
              puVar15 = *(undefined8 **)(lVar71 + 0xc0);
              for (puVar76 = *(undefined8 **)(lVar71 + 0xb8); _Var45._M_node = _Var66._M_node,
                  puVar76 != puVar15; puVar76 = puVar76 + 1) {
                paVar60 = (aiNode *)
                          Assimp::STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcProduct>
                                    ((LazyObject *)*puVar76);
                lVar71 = __dynamic_cast((paVar60->mName).data +
                                        *(long *)(*(long *)&paVar60->mName + -0x18) + -4,
                                        &Assimp::STEP::Object::typeinfo,
                                        &Assimp::IFC::Schema_2x3::IfcOpeningElement::typeinfo);
                if ((lVar71 == 0) &&
                   (local_438._0_8_ =
                         ProcessSpatialStructure
                                   ((anon_unknown_dwarf_d4b12f *)local_7d0,paVar60,el,
                                    (ConversionData *)0x0,collect_openings),
                   (aiNode *)local_438._0_8_ != (aiNode *)0x0)) {
                  if (iStack_750._M_current == local_748) {
                    std::vector<aiNode*,std::allocator<aiNode*>>::_M_realloc_insert<aiNode*const&>
                              ((vector<aiNode*,std::allocator<aiNode*>> *)&local_758,iStack_750,
                               (aiNode **)local_438);
                  }
                  else {
                    *iStack_750._M_current = (aiNode *)local_438._0_8_;
                    iStack_750._M_current = iStack_750._M_current + 1;
                  }
                }
              }
            }
          }
        }
        _Var49._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var49._M_node);
        pVar113.second._M_node = _Var45._M_node;
        pVar113.first._M_node = _Var49._M_node;
      } while (_Var49._M_node != _Var45._M_node);
    }
    if (local_7d8 != _Var45._M_node) {
      puVar1 = &el[1].super_IfcObject.field_0x48;
      do {
        puVar63 = *(undefined1 **)&el[1].super_IfcObject.field_0x50;
        puVar53 = puVar1;
        if (puVar63 != (undefined1 *)0x0) {
          do {
            bVar80 = *(_Base_ptr *)(puVar63 + 0x20) < local_7d8[1]._M_parent;
            if (!bVar80) {
              puVar53 = puVar63;
            }
            puVar63 = *(undefined1 **)(puVar63 + (ulong)bVar80 * 8 + 0x10);
          } while (puVar63 != (undefined1 *)0x0);
        }
        puVar63 = puVar1;
        if ((puVar53 != puVar1) &&
           (puVar63 = puVar53, local_7d8[1]._M_parent < *(_Base_ptr *)(puVar53 + 0x20))) {
          puVar63 = puVar1;
        }
        if (puVar63 == puVar1) {
          pLVar54 = Assimp::STEP::DB::GetObject
                              (*(DB **)&(el->super_IfcObject).field_0x18,
                               (uint64_t)local_7d8[1]._M_parent);
          pOVar55 = Assimp::STEP::LazyObject::operator*(pLVar54);
          lVar71 = __dynamic_cast(pOVar55,&Assimp::STEP::Object::typeinfo,
                                  &Assimp::IFC::Schema_2x3::IfcRelAggregates::typeinfo,
                                  0xffffffffffffffff);
          if ((lVar71 != 0) &&
             (pIVar56 = Assimp::STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcObjectDefinition>
                                  (*(LazyObject **)(lVar71 + 0xa8)),
             *(long *)((pIVar56->super_IfcRoot).
                       super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>._vptr_ObjectHelper
                       [-3] + (long)&(pIVar56->super_IfcRoot).
                                     super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>.
                                     aux_is_derived.super__Base_bitset<1UL>) ==
             *(long *)((parent->mName).data + *(long *)(*(long *)&parent->mName + -0x18) + 4))) {
            paVar60 = (aiNode *)operator_new(0x478);
            aiNode::aiNode(paVar60);
            (paVar60->mName).length = 0xe;
            builtin_strncpy((paVar60->mName).data,"$RelAggregates",0xf);
            paVar60->mParent = local_7d0;
            fVar2 = (local_7d0->mTransformation).a2;
            fVar3 = (local_7d0->mTransformation).a3;
            fVar4 = (local_7d0->mTransformation).a4;
            fVar5 = (local_7d0->mTransformation).b1;
            fVar6 = (local_7d0->mTransformation).b2;
            fVar7 = (local_7d0->mTransformation).b3;
            fVar8 = (local_7d0->mTransformation).b4;
            fVar9 = (local_7d0->mTransformation).c1;
            fVar10 = (local_7d0->mTransformation).c2;
            fVar11 = (local_7d0->mTransformation).c3;
            fVar12 = (local_7d0->mTransformation).c4;
            fVar13 = (local_7d0->mTransformation).d1;
            fVar82 = (local_7d0->mTransformation).d2;
            fVar83 = (local_7d0->mTransformation).d3;
            fVar84 = (local_7d0->mTransformation).d4;
            (paVar60->mTransformation).a1 = (local_7d0->mTransformation).a1;
            (paVar60->mTransformation).a2 = fVar2;
            (paVar60->mTransformation).a3 = fVar3;
            (paVar60->mTransformation).a4 = fVar4;
            (paVar60->mTransformation).b1 = fVar5;
            (paVar60->mTransformation).b2 = fVar6;
            (paVar60->mTransformation).b3 = fVar7;
            (paVar60->mTransformation).b4 = fVar8;
            (paVar60->mTransformation).c1 = fVar9;
            (paVar60->mTransformation).c2 = fVar10;
            (paVar60->mTransformation).c3 = fVar11;
            (paVar60->mTransformation).c4 = fVar12;
            (paVar60->mTransformation).d1 = fVar13;
            (paVar60->mTransformation).d2 = fVar82;
            (paVar60->mTransformation).d3 = fVar83;
            (paVar60->mTransformation).d4 = fVar84;
            uVar78 = *(long *)(lVar71 + 0xb8) - *(long *)(lVar71 + 0xb0);
            if ((long)uVar78 < 0) {
              uVar78 = 0xffffffffffffffff;
            }
            local_438._0_8_ = paVar60;
            ppaVar57 = (aiNode **)operator_new__(uVar78);
            memset(ppaVar57,0,uVar78);
            paVar60->mChildren = ppaVar57;
            puVar15 = *(undefined8 **)(lVar71 + 0xb8);
            for (puVar76 = *(undefined8 **)(lVar71 + 0xb0); uVar40 = local_438._0_8_,
                puVar76 != puVar15; puVar76 = puVar76 + 1) {
              pIVar56 = Assimp::STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcObjectDefinition>
                                  ((LazyObject *)*puVar76);
              paVar60 = (aiNode *)
                        __dynamic_cast((_func_int *)
                                       ((long)&(pIVar56->super_IfcRoot).
                                               super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>
                                               ._vptr_ObjectHelper +
                                       (long)(pIVar56->super_IfcRoot).
                                             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>
                                             ._vptr_ObjectHelper[-3]),
                                       &Assimp::STEP::Object::typeinfo,
                                       &Assimp::IFC::Schema_2x3::IfcProduct::typeinfo);
              if ((paVar60 != (aiNode *)0x0) &&
                 (paVar60 = ProcessSpatialStructure
                                      ((anon_unknown_dwarf_d4b12f *)local_438._0_8_,paVar60,el,
                                       (ConversionData *)0x0,collect_openings),
                 paVar60 != (aiNode *)0x0)) {
                uVar68 = *(uint *)(local_438._0_8_ + 0x450);
                *(uint *)(local_438._0_8_ + 0x450) = uVar68 + 1;
                (*(aiNode ***)(local_438._0_8_ + 0x458))[uVar68] = paVar60;
              }
            }
            local_438._0_8_ = (aiNode *)0x0;
            local_5d8._0_8_ = uVar40;
            if (iStack_750._M_current == local_748) {
              std::vector<aiNode*,std::allocator<aiNode*>>::_M_realloc_insert<aiNode*>
                        ((vector<aiNode*,std::allocator<aiNode*>> *)&local_758,iStack_750,
                         (aiNode **)local_5d8);
            }
            else {
              *iStack_750._M_current = (aiNode *)uVar40;
              iStack_750._M_current = iStack_750._M_current + 1;
            }
            uVar40 = local_438._0_8_;
            _Var45._M_node = _Var66._M_node;
            if ((aiNode *)local_438._0_8_ != (aiNode *)0x0) {
              aiNode::~aiNode((aiNode *)local_438._0_8_);
              operator_delete((void *)uVar40);
            }
          }
        }
        local_7d8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(local_7d8);
      } while (local_7d8 != _Var45._M_node);
    }
    *(ConversionData **)&el[1].super_IfcObject.field_0x38 = local_4f0;
    if (local_4f0 == (ConversionData *)0x0) {
      *(vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_> **)
       &el[1].super_IfcObject.field_0x30 = &local_508;
    }
    if ((char)local_740 == '\0') {
      if ((parent->mName).data[0xf4] == '\x01') {
        uVar68 = Assimp::IFC::ProcessMaterials
                           (*(uint64_t *)
                             ((parent->mName).data + *(long *)(*(long *)&parent->mName + -0x18) + 4)
                            ,0xffffffff,(ConversionData *)el,false);
        local_728 = (element_type *)CONCAT44(local_728._4_4_,uVar68);
        local_488._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_488._M_impl.super__Rb_tree_header._M_header;
        local_488._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_488._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_488._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_488._M_impl.super__Rb_tree_header._M_header._M_right =
             local_488._M_impl.super__Rb_tree_header._M_header._M_left;
        if ((parent->mName).data[0xf4] == '\0') {
          __assert_fail("have",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/./code/Step/STEPFile.h"
                        ,0x240,
                        "const T &Assimp::STEP::Maybe<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProductRepresentation>>::Get() const [T = Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProductRepresentation>]"
                       );
        }
        pIVar58 = Assimp::STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcProductRepresentation>
                            (*(LazyObject **)((parent->mName).data + 0xec));
        std::
        vector<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*,_std::allocator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*>_>
        ::vector(&local_540,
                 (long)(pIVar58->Representations).
                       super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>_>_>
                       .
                       super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(pIVar58->Representations).
                       super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>_>_>
                       .
                       super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3,(allocator_type *)local_438);
        std::__copy_move<false,false,std::random_access_iterator_tag>::
        __copy_m<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>const*,Assimp::IFC::Schema_2x3::IfcRepresentation_const**>
                  ((pIVar58->Representations).
                   super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>_>_>
                   .
                   super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   (pIVar58->Representations).
                   super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>_>_>
                   .
                   super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
                   local_540.
                   super__Vector_base<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*,_std::allocator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*>_>
                   ._M_impl.super__Vector_impl_data._M_start);
        ppIVar39 = local_540.
                   super__Vector_base<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*,_std::allocator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        ppIVar38 = local_540.
                   super__Vector_base<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*,_std::allocator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        paVar60 = (aiNode *)
                  local_540.
                  super__Vector_base<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*,_std::allocator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (local_540.
            super__Vector_base<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*,_std::allocator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_540.
            super__Vector_base<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*,_std::allocator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          lVar43 = (long)local_540.
                         super__Vector_base<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*,_std::allocator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_540.
                         super__Vector_base<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*,_std::allocator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*>_>
                         ._M_impl.super__Vector_impl_data._M_start;
          uVar78 = lVar43 >> 3;
          lVar71 = 0x3f;
          if (uVar78 != 0) {
            for (; uVar78 >> lVar71 == 0; lVar71 = lVar71 + -1) {
            }
          }
          std::
          __introsort_loop<__gnu_cxx::__normal_iterator<Assimp::IFC::Schema_2x3::IfcRepresentation_const**,std::vector<Assimp::IFC::Schema_2x3::IfcRepresentation_const*,std::allocator<Assimp::IFC::Schema_2x3::IfcRepresentation_const*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::RateRepresentationPredicate>>
                    (local_540.
                     super__Vector_base<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*,_std::allocator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     local_540.
                     super__Vector_base<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*,_std::allocator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar71 ^ 0x3f) * 2 ^ 0x7e);
          if (lVar43 < 0x81) {
            std::
            __insertion_sort<__gnu_cxx::__normal_iterator<Assimp::IFC::Schema_2x3::IfcRepresentation_const**,std::vector<Assimp::IFC::Schema_2x3::IfcRepresentation_const*,std::allocator<Assimp::IFC::Schema_2x3::IfcRepresentation_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::RateRepresentationPredicate>>
                      (ppIVar38,ppIVar39);
            paVar60 = (aiNode *)
                      local_540.
                      super__Vector_base<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*,_std::allocator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          }
          else {
            paVar52 = (aiNode *)(((aiString *)ppIVar38)->data + 0x7c);
            std::
            __insertion_sort<__gnu_cxx::__normal_iterator<Assimp::IFC::Schema_2x3::IfcRepresentation_const**,std::vector<Assimp::IFC::Schema_2x3::IfcRepresentation_const*,std::allocator<Assimp::IFC::Schema_2x3::IfcRepresentation_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::RateRepresentationPredicate>>
                      (ppIVar38,paVar52);
            for (; paVar60 = (aiNode *)
                             local_540.
                             super__Vector_base<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*,_std::allocator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*>_>
                             ._M_impl.super__Vector_impl_data._M_start,
                paVar52 != (aiNode *)ppIVar39; paVar52 = (aiNode *)((paVar52->mName).data + 4)) {
              std::
              __unguarded_linear_insert<__gnu_cxx::__normal_iterator<Assimp::IFC::Schema_2x3::IfcRepresentation_const**,std::vector<Assimp::IFC::Schema_2x3::IfcRepresentation_const*,std::allocator<Assimp::IFC::Schema_2x3::IfcRepresentation_const*>>>,__gnu_cxx::__ops::_Val_comp_iter<(anonymous_namespace)::RateRepresentationPredicate>>
                        (paVar52);
            }
          }
        }
        for (; paVar60 !=
               (aiNode *)
               local_540.
               super__Vector_base<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*,_std::allocator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
            paVar60 = (aiNode *)((paVar60->mName).data + 4)) {
          p_Var48 = *(_Rb_tree_node_base **)(*(long *)&paVar60->mName + 0x68);
          local_610 = *(_Rb_tree_node_base **)(*(long *)&paVar60->mName + 0x70);
          if (p_Var48 == local_610) {
            bVar80 = false;
          }
          else {
            bVar80 = false;
            local_6c8 = paVar60;
            do {
              local_6c0 = p_Var48;
              pIVar59 = (IFC *)Assimp::STEP::LazyObject::
                               To<Assimp::IFC::Schema_2x3::IfcRepresentationItem>
                                         (*(LazyObject **)p_Var48);
              plVar44 = (long *)__dynamic_cast(pIVar59 + *(long *)(*(long *)pIVar59 + -0x18),
                                               &Assimp::STEP::Object::typeinfo,
                                               &Assimp::IFC::Schema_2x3::IfcMappedItem::typeinfo,
                                               0xffffffffffffffff);
              if (plVar44 == (long *)0x0) {
                bVar42 = Assimp::IFC::ProcessRepresentationItem
                                   (pIVar59,(IfcRepresentationItem *)((ulong)local_728 & 0xffffffff)
                                    ,(uint)&local_488,
                                    (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                                     *)el,(ConversionData *)collect_openings);
              }
              else {
                paVar60 = (aiNode *)operator_new(0x478);
                aiNode::aiNode(paVar60);
                (paVar60->mName).length = 0xd;
                builtin_strncpy((paVar60->mName).data,"IfcMappedItem",0xe);
                local_5d8._0_8_ = (aiNode *)0x3ff0000000000000;
                p_Stack_5c0 = (_Rb_tree_node_base *)0x0;
                p_Stack_5b8 = (_Rb_tree_node_base *)0x0;
                local_5d8._8_8_ = (_Base_ptr)0x0;
                pIStack_5c8 = (IfcProject *)0x0;
                local_5b0 = (_Base_ptr)0x3ff0000000000000;
                local_598 = (_Base_ptr)0x0;
                p_Stack_590 = (_Base_ptr)0x0;
                local_5a8 = (_Base_ptr)0x0;
                p_Stack_5a0 = (_Rb_tree_node_base *)0x0;
                local_588 = (_Base_ptr)0x3ff0000000000000;
                local_570 = (vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
                             *)0x0;
                pvStack_568 = (vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
                               *)0x0;
                local_580 = 0.0;
                pSStack_578 = (Settings *)0x0;
                local_560 = 1.0;
                local_6d0 = paVar60;
                op_00 = Assimp::STEP::LazyObject::
                        To<Assimp::IFC::Schema_2x3::IfcCartesianTransformationOperator>
                                  ((LazyObject *)plVar44[5]);
                Assimp::IFC::ConvertTransformOperator((IfcMatrix4 *)local_5d8,op_00);
                local_6b8._0_8_ = (pointer)0x3ff0000000000000;
                TStack_6a8.extrusionDir.x = 0.0;
                TStack_6a8.extrusionDir.y = 0.0;
                local_6b8._8_8_ = (pointer)0x0;
                TStack_6a8.solid = (IfcSolidModel *)0x0;
                TStack_6a8.extrusionDir.z = 1.0;
                TStack_6a8.profileMesh2D.
                super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)0x0;
                TStack_6a8.profileMesh2D.
                super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                TStack_6a8.profileMesh.
                super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)0x0;
                TStack_6a8.profileMesh.
                super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                TStack_6a8.wallPoints.
                super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl
                .super__Vector_impl_data._M_start = (pointer)0x3ff0000000000000;
                local_650 = (Settings *)0x0;
                dStack_648 = 0.0;
                TStack_6a8.wallPoints.
                super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl
                .super__Vector_impl_data._M_finish = (pointer)0x0;
                TStack_6a8.wallPoints.
                super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                local_640 = (_Base_ptr)0x3ff0000000000000;
                pIVar61 = Assimp::STEP::LazyObject::
                          To<Assimp::IFC::Schema_2x3::IfcRepresentationMap>
                                    ((LazyObject *)plVar44[4]);
                Assimp::IFC::ConvertAxisPlacement
                          ((IfcMatrix4 *)local_6b8,
                           *(IfcAxis2Placement **)
                            &(pIVar61->
                             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationMap,_2UL>)
                             .field_0x10,(ConversionData *)el);
                local_710 = local_650;
                local_718 = (_Rb_tree_node_base *)
                            TStack_6a8.wallPoints.
                            super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                local_730 = (aiNode *)
                            (dStack_648 * (double)p_Stack_5c0 +
                            (double)TStack_6a8.wallPoints.
                                    super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start * (double)pIStack_5c8
                            + (double)TStack_6a8.solid * (double)local_5d8._0_8_ +
                              (double)local_5d8._8_8_ *
                              (double)TStack_6a8.profileMesh.
                                      super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr);
                local_720 = (aiNode *)
                            TStack_6a8.profileMesh.
                            super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi;
                local_708 = local_640;
                local_738 = (DB *)((double)p_Stack_5c0 * (double)local_640 +
                                  (double)pIStack_5c8 *
                                  (double)TStack_6a8.wallPoints.
                                          super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish +
                                  (double)local_5d8._0_8_ * TStack_6a8.extrusionDir.x +
                                  (double)local_5d8._8_8_ *
                                  (double)TStack_6a8.profileMesh.
                                          super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount._M_pi);
                local_700 = (IfcProject *)TStack_6a8.extrusionDir.y;
                local_6f8 = TStack_6a8.profileMesh2D.
                            super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr;
                local_6d8 = (IfcProject *)
                            ((double)TStack_6a8.wallPoints.
                                     super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage *
                             (double)p_Stack_5a0 +
                            (double)TStack_6a8.profileMesh2D.
                                    super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr * (double)local_5a8 +
                            (double)local_6b8._0_8_ * (double)p_Stack_5b8 +
                            (double)local_5b0 * TStack_6a8.extrusionDir.y);
                local_6e0 = (aiScene *)
                            ((double)local_650 * (double)p_Stack_5a0 +
                            (double)TStack_6a8.profileMesh2D.
                                    super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount._M_pi * (double)local_5a8 +
                            (double)local_6b8._8_8_ * (double)p_Stack_5b8 +
                            (double)local_5b0 * TStack_6a8.extrusionDir.z);
                local_6e8 = (element_type *)
                            (dStack_648 * (double)p_Stack_5a0 +
                            (double)TStack_6a8.wallPoints.
                                    super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start * (double)local_5a8 +
                            (double)TStack_6a8.solid * (double)p_Stack_5b8 +
                            (double)local_5b0 *
                            (double)TStack_6a8.profileMesh.
                                    super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr);
                dVar18 = (double)p_Stack_5b8 * TStack_6a8.extrusionDir.x;
                local_6f0 = (element_type *)
                            ((double)TStack_6a8.wallPoints.
                                     super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage * local_580
                            + (double)TStack_6a8.profileMesh2D.
                                      super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr * (double)local_588 +
                              (double)local_6b8._0_8_ * (double)local_598 +
                              (double)p_Stack_590 * TStack_6a8.extrusionDir.y);
                dVar93 = (double)p_Stack_590 * TStack_6a8.extrusionDir.z;
                dVar105 = (double)local_6b8._8_8_ * (double)local_598;
                dVar94 = (double)p_Stack_590 *
                         (double)TStack_6a8.profileMesh.
                                 super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr;
                dVar111 = (double)TStack_6a8.solid * (double)local_598;
                dVar27 = (double)p_Stack_590 *
                         (double)TStack_6a8.profileMesh.
                                 super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi;
                dVar24 = (double)local_598 * TStack_6a8.extrusionDir.x;
                dVar28 = TStack_6a8.extrusionDir.y * (double)local_570;
                dVar110 = (double)local_6b8._0_8_ * (double)pSStack_578;
                dVar102 = (double)TStack_6a8.profileMesh2D.
                                  super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr * (double)pvStack_568;
                dVar19 = TStack_6a8.extrusionDir.z * (double)local_570;
                dVar112 = (double)local_6b8._8_8_ * (double)pSStack_578;
                dVar20 = (double)TStack_6a8.profileMesh2D.
                                 super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi * (double)pvStack_568;
                dVar21 = (double)TStack_6a8.profileMesh.
                                 super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr * (double)local_570;
                dVar98 = (double)TStack_6a8.solid * (double)pSStack_578;
                dVar22 = (double)TStack_6a8.wallPoints.
                                 super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start * (double)pvStack_568;
                dVar25 = (double)local_570 *
                         (double)TStack_6a8.profileMesh.
                                 super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi;
                dVar23 = TStack_6a8.extrusionDir.x * (double)pSStack_578;
                dVar26 = (double)TStack_6a8.wallPoints.
                                 super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish * (double)pvStack_568;
                local_6b8._0_8_ =
                     (TempOpening *)
                     ((double)TStack_6a8.wallPoints.
                              super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage *
                      (double)p_Stack_5c0 +
                     (double)TStack_6a8.profileMesh2D.
                             super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr * (double)pIStack_5c8 +
                     (double)local_6b8._0_8_ * (double)local_5d8._0_8_ +
                     (double)local_5d8._8_8_ * TStack_6a8.extrusionDir.y);
                local_6b8._8_8_ =
                     (TempOpening *)
                     ((double)local_650 * (double)p_Stack_5c0 +
                     (double)TStack_6a8.profileMesh2D.
                             super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi * (double)pIStack_5c8 +
                     (double)local_6b8._8_8_ * (double)local_5d8._0_8_ +
                     (double)local_5d8._8_8_ * TStack_6a8.extrusionDir.z);
                TStack_6a8.solid = (IfcSolidModel *)local_730;
                TStack_6a8.extrusionDir.x = (double)local_738;
                TStack_6a8.extrusionDir.y = (double)local_6d8;
                TStack_6a8.extrusionDir.z = (double)local_6e0;
                TStack_6a8.profileMesh.
                super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     local_6e8;
                TStack_6a8.profileMesh.
                super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                        ((double)p_Stack_5a0 * (double)local_640 +
                        (double)local_5a8 *
                        (double)TStack_6a8.wallPoints.
                                super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish +
                        dVar18 + (double)local_5b0 *
                                 (double)TStack_6a8.profileMesh.
                                         super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_refcount._M_pi);
                TStack_6a8.profileMesh2D.
                super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     local_6f0;
                TStack_6a8.profileMesh2D.
                super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                        ((double)local_650 * local_580 +
                        (double)TStack_6a8.profileMesh2D.
                                super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount._M_pi * (double)local_588 + dVar105 + dVar93);
                TStack_6a8.wallPoints.
                super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl
                .super__Vector_impl_data._M_start =
                     (pointer)(dStack_648 * local_580 +
                              (double)TStack_6a8.wallPoints.
                                      super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start * (double)local_588
                              + dVar111 + dVar94);
                TStack_6a8.wallPoints.
                super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl
                .super__Vector_impl_data._M_finish =
                     (pointer)(local_580 * (double)local_640 +
                              (double)local_588 *
                              (double)TStack_6a8.wallPoints.
                                      super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish + dVar24 + dVar27);
                TStack_6a8.wallPoints.
                super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage =
                     (pointer)((double)TStack_6a8.wallPoints.
                                       super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage *
                               local_560 + dVar102 + dVar110 + dVar28);
                local_650 = (Settings *)((double)local_650 * local_560 + dVar20 + dVar112 + dVar19);
                dStack_648 = dStack_648 * local_560 + dVar22 + dVar98 + dVar21;
                local_640 = (_Base_ptr)((double)local_640 * local_560 + dVar26 + dVar23 + dVar25);
                local_600._0_8_ = local_600._0_8_ & 0xffffffff00000000;
                local_600._8_8_ = (_Base_ptr)0x0;
                p_Stack_5f0 = (_Base_ptr)local_600;
                local_5e8 = (_Base_ptr)local_600;
                local_5e0 = (pointer)0x0;
                plVar64 = *(long **)&el[1].super_IfcObject.field_0x38;
                lVar71 = 0;
                if (plVar64 != (long *)0x0) {
                  lVar71 = (plVar64[1] - *plVar64 >> 3) * 0x2e8ba2e8ba2e8ba3;
                }
                if (*(long *)&el[1].super_IfcObject.field_0x30 != 0) {
                  pdVar72 = (double *)local_6b8;
                  paVar74 = (aiMatrix4x4t<double> *)local_438;
                  for (lVar43 = 0x10; lVar43 != 0; lVar43 = lVar43 + -1) {
                    paVar74->a1 = *pdVar72;
                    pdVar72 = pdVar72 + (ulong)bVar81 * -2 + 1;
                    paVar74 = (aiMatrix4x4t<double> *)((long)paVar74 + (ulong)bVar81 * -0x10 + 8);
                  }
                  aiMatrix4x4t<double>::Inverse((aiMatrix4x4t<double> *)local_438);
                  puVar76 = *(undefined8 **)&el[1].super_IfcObject.field_0x30;
                  pTVar79 = (TempOpening *)puVar76[1];
                  for (pTVar77 = (TempOpening *)*puVar76; pTVar77 != pTVar79; pTVar77 = pTVar77 + 1)
                  {
                    Assimp::IFC::TempOpening::Transform(pTVar77,(IfcMatrix4 *)local_438);
                  }
                }
                uVar68 = Assimp::IFC::ProcessMaterials
                                   (*(uint64_t *)((long)plVar44 + *(long *)(*plVar44 + -0x18) + 8),
                                    (uint)local_728,(ConversionData *)el,false);
                pIVar61 = Assimp::STEP::LazyObject::
                          To<Assimp::IFC::Schema_2x3::IfcRepresentationMap>
                                    ((LazyObject *)plVar44[4]);
                pIVar62 = Assimp::STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcRepresentation>
                                    (*(LazyObject **)
                                      &(pIVar61->
                                       super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationMap,_2UL>
                                       ).field_0x20);
                pLVar70 = (pIVar62->Items).
                          super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>_>_>
                          .
                          super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                pLVar16 = (pIVar62->Items).
                          super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>_>_>
                          .
                          super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
                if (pLVar70 == pLVar16) {
                  bVar42 = false;
                }
                else {
                  bVar75 = false;
                  do {
                    pIVar59 = (IFC *)Assimp::STEP::LazyObject::
                                     To<Assimp::IFC::Schema_2x3::IfcRepresentationItem>
                                               (pLVar70->obj);
                    bVar41 = Assimp::IFC::ProcessRepresentationItem
                                       (pIVar59,(IfcRepresentationItem *)(ulong)uVar68,
                                        (uint)local_608,
                                        (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                                         *)el,(ConversionData *)collect_openings);
                    bVar42 = true;
                    if (!bVar41) {
                      std::__cxx11::string::string
                                ((string *)local_458,
                                 *(char **)(pIVar59 + *(long *)(*(long *)pIVar59 + -0x18) + 0x10),
                                 &local_739);
                      collect_openings =
                           (vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
                            *)0x1f;
                      plVar44 = (long *)std::__cxx11::string::replace
                                                  ((ulong)local_458,0,(char *)0x0,0x78d6e9);
                      local_528 = &local_518;
                      plVar64 = plVar44 + 2;
                      if ((long *)*plVar44 == plVar64) {
                        local_518 = *plVar64;
                        lStack_510 = plVar44[3];
                      }
                      else {
                        local_518 = *plVar64;
                        local_528 = (long *)*plVar44;
                      }
                      local_520 = plVar44[1];
                      *plVar44 = (long)plVar64;
                      plVar44[1] = 0;
                      *(undefined1 *)(plVar44 + 2) = 0;
                      plVar44 = (long *)std::__cxx11::string::append((char *)&local_528);
                      psVar65 = (size_type *)(plVar44 + 2);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)*plVar44 ==
                          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)psVar65) {
                        local_630.field_2._M_allocated_capacity = *psVar65;
                        local_630.field_2._8_8_ = plVar44[3];
                        local_630._M_dataplus._M_p = (pointer)&local_630.field_2;
                      }
                      else {
                        local_630.field_2._M_allocated_capacity = *psVar65;
                        local_630._M_dataplus._M_p = (pointer)*plVar44;
                      }
                      local_630._M_string_length = plVar44[1];
                      *plVar44 = (long)psVar65;
                      plVar44[1] = 0;
                      *(undefined1 *)(plVar44 + 2) = 0;
                      Assimp::Formatter::
                      basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                      basic_formatter<std::__cxx11::string>
                                ((basic_formatter<char,std::char_traits<char>,std::allocator<char>>
                                  *)local_438,&local_630);
                      Assimp::LogFunctions<Assimp::IFCImporter>::LogWarn((format *)local_438);
                      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_438);
                      std::ios_base::~ios_base((ios_base *)&dStack_3c8);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_630._M_dataplus._M_p != &local_630.field_2) {
                        operator_delete(local_630._M_dataplus._M_p);
                      }
                      if (local_528 != &local_518) {
                        operator_delete(local_528);
                      }
                      bVar42 = bVar75;
                      if (local_458[0] != local_448) {
                        operator_delete(local_458[0]);
                      }
                    }
                    pLVar70 = pLVar70 + 1;
                    bVar75 = bVar42;
                  } while (pLVar70 != pLVar16);
                }
                paVar60 = local_6c8;
                if (bVar42 != false) {
                  Assimp::IFC::AssignAddedMeshes
                            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                              *)local_608,local_6d0,(ConversionData *)el);
                  plVar44 = *(long **)&el[1].super_IfcObject.field_0x38;
                  if ((plVar44 != (long *)0x0) &&
                     (lVar43 = (plVar44[1] - *plVar44 >> 3) * 0x2e8ba2e8ba2e8ba3 - lVar71,
                     lVar43 != 0)) {
                    lVar71 = lVar71 * 0x58;
                    do {
                      Assimp::IFC::TempOpening::Transform
                                ((TempOpening *)
                                 (**(long **)&el[1].super_IfcObject.field_0x38 + lVar71),
                                 (IfcMatrix4 *)local_6b8);
                      lVar71 = lVar71 + 0x58;
                      lVar43 = lVar43 + -1;
                    } while (lVar43 != 0);
                  }
                  local_438._0_8_ = local_6d0;
                  fVar109 = (float)(double)local_6b8._0_8_;
                  fVar99 = (float)(double)local_6b8._8_8_;
                  fVar85 = (float)TStack_6a8.extrusionDir.y;
                  fVar104 = (float)TStack_6a8.extrusionDir.z;
                  fVar95 = (float)(double)TStack_6a8.profileMesh.
                                          super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_ptr;
                  fVar107 = (float)(double)TStack_6a8.profileMesh2D.
                                           super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr;
                  fVar103 = (float)(double)TStack_6a8.profileMesh2D.
                                           super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_refcount._M_pi;
                  fVar106 = (float)(double)TStack_6a8.wallPoints.
                                           super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
                  fVar101 = (float)(double)local_650;
                  fVar2 = (local_7d0->mTransformation).a1;
                  fVar3 = (local_7d0->mTransformation).a2;
                  fVar4 = (local_7d0->mTransformation).a3;
                  fVar5 = (local_7d0->mTransformation).a4;
                  fVar86 = fVar106 * fVar5 + fVar107 * fVar4 + fVar109 * fVar2 + fVar3 * fVar85;
                  local_6d8 = (IfcProject *)CONCAT44(local_6d8._4_4_,fVar86);
                  fVar87 = fVar101 * fVar5 + fVar103 * fVar4 + fVar99 * fVar2 + fVar3 * fVar104;
                  local_6e0 = (aiScene *)CONCAT44(local_6e0._4_4_,fVar87);
                  fVar100 = (float)(double)TStack_6a8.solid;
                  fVar96 = (float)(double)TStack_6a8.wallPoints.
                                          super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start;
                  fVar97 = (float)TStack_6a8.extrusionDir.x;
                  local_738 = (DB *)CONCAT44(local_738._4_4_,fVar97);
                  fVar88 = (float)dStack_648;
                  local_730 = (aiNode *)CONCAT44(local_730._4_4_,fVar88);
                  fVar108 = (float)(double)TStack_6a8.profileMesh.
                                           super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_refcount._M_pi;
                  fVar89 = fVar88 * fVar5 + fVar96 * fVar4 + fVar100 * fVar2 + fVar3 * fVar95;
                  local_6e8 = (element_type *)CONCAT44(local_6e8._4_4_,fVar89);
                  local_720 = (aiNode *)CONCAT44(local_720._4_4_,fVar108);
                  fVar83 = (float)(double)TStack_6a8.wallPoints.
                                          super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish;
                  fVar82 = (float)(double)local_640;
                  local_718 = (_Rb_tree_node_base *)CONCAT44(local_718._4_4_,fVar82);
                  fVar92 = fVar5 * fVar82 + fVar4 * fVar83 + fVar2 * fVar97 + fVar3 * fVar108;
                  local_6f0 = (element_type *)CONCAT44(local_6f0._4_4_,fVar92);
                  fVar2 = (local_7d0->mTransformation).b2;
                  fVar3 = (local_7d0->mTransformation).b1;
                  fVar4 = (local_7d0->mTransformation).b3;
                  local_710 = (Settings *)CONCAT44(local_710._4_4_,fVar107);
                  fVar5 = (local_7d0->mTransformation).b4;
                  fVar84 = fVar106 * fVar5 + fVar107 * fVar4 + fVar109 * fVar3 + fVar2 * fVar85;
                  local_6f8 = (element_type *)CONCAT44(local_6f8._4_4_,fVar84);
                  fVar90 = fVar101 * fVar5 + fVar103 * fVar4 + fVar99 * fVar3 + fVar2 * fVar104;
                  local_700 = (IfcProject *)CONCAT44(local_700._4_4_,fVar90);
                  fVar91 = fVar88 * fVar5 + fVar96 * fVar4 + fVar100 * fVar3 + fVar2 * fVar95;
                  local_708 = (_Base_ptr)CONCAT44(local_708._4_4_,fVar91);
                  fVar6 = (local_7d0->mTransformation).c2;
                  fVar7 = (local_7d0->mTransformation).c1;
                  fVar8 = (local_7d0->mTransformation).c3;
                  fVar9 = (local_7d0->mTransformation).c4;
                  fVar10 = (local_7d0->mTransformation).d2;
                  fVar11 = (local_7d0->mTransformation).d1;
                  fVar12 = (local_7d0->mTransformation).d3;
                  fVar13 = (local_7d0->mTransformation).d4;
                  (local_6d0->mTransformation).a1 = fVar86;
                  (local_6d0->mTransformation).a2 = fVar87;
                  (local_6d0->mTransformation).a3 = fVar89;
                  (local_6d0->mTransformation).a4 = fVar92;
                  (local_6d0->mTransformation).b1 = fVar84;
                  (local_6d0->mTransformation).b2 = fVar90;
                  (local_6d0->mTransformation).b3 = fVar91;
                  (local_6d0->mTransformation).b4 =
                       fVar5 * fVar82 + fVar4 * fVar83 + fVar3 * fVar97 + fVar2 * fVar108;
                  (local_6d0->mTransformation).c1 =
                       fVar106 * fVar9 + fVar107 * fVar8 + fVar109 * fVar7 + fVar6 * fVar85;
                  (local_6d0->mTransformation).c2 =
                       fVar101 * fVar9 + fVar103 * fVar8 + fVar99 * fVar7 + fVar6 * fVar104;
                  (local_6d0->mTransformation).c3 =
                       fVar88 * fVar9 + fVar96 * fVar8 + fVar100 * fVar7 + fVar6 * fVar95;
                  (local_6d0->mTransformation).c4 =
                       fVar9 * fVar82 + fVar8 * fVar83 + fVar7 * fVar97 + fVar6 * fVar108;
                  (local_6d0->mTransformation).d1 =
                       fVar106 * fVar13 + fVar107 * fVar12 + fVar109 * fVar11 + fVar85 * fVar10;
                  (local_6d0->mTransformation).d2 =
                       fVar101 * fVar13 + fVar103 * fVar12 + fVar99 * fVar11 + fVar104 * fVar10;
                  (local_6d0->mTransformation).d3 =
                       fVar88 * fVar13 + fVar96 * fVar12 + fVar100 * fVar11 + fVar95 * fVar10;
                  (local_6d0->mTransformation).d4 =
                       fVar82 * fVar13 + fVar83 * fVar12 + fVar97 * fVar11 + fVar10 * fVar108;
                  local_6d0 = (aiNode *)0x0;
                  if (iStack_750._M_current == local_748) {
                    std::vector<aiNode*,std::allocator<aiNode*>>::_M_realloc_insert<aiNode*>
                              ((vector<aiNode*,std::allocator<aiNode*>> *)&local_758,iStack_750,
                               (aiNode **)local_438);
                  }
                  else {
                    *iStack_750._M_current = (aiNode *)local_438._0_8_;
                    iStack_750._M_current = iStack_750._M_current + 1;
                  }
                }
                std::
                _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                             *)local_608);
                paVar52 = local_6d0;
                if (local_6d0 != (aiNode *)0x0) {
                  aiNode::~aiNode(local_6d0);
                  operator_delete(paVar52);
                }
              }
              if (bVar42 != false) {
                bVar80 = true;
              }
              p_Var48 = (_Rb_tree_node_base *)&local_6c0->_M_parent;
            } while (p_Var48 != local_610);
          }
          if (bVar80) break;
        }
        Assimp::IFC::AssignAddedMeshes
                  ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                   &local_488,local_7d0,(ConversionData *)el);
        if ((aiNode *)
            local_540.
            super__Vector_base<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*,_std::allocator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*>_>
            ._M_impl.super__Vector_impl_data._M_start != (aiNode *)0x0) {
          operator_delete(local_540.
                          super__Vector_base<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*,_std::allocator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        std::
        _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
        ::~_Rb_tree(&local_488);
      }
      *(undefined8 *)&el[1].super_IfcObject.field_0x30 = 0;
      *(undefined8 *)&el[1].super_IfcObject.field_0x38 = 0;
    }
    iVar36._M_current = iStack_750._M_current;
    ppaVar57 = local_758;
    uVar78 = (long)iStack_750._M_current - (long)local_758;
    if (uVar78 != 0) {
      __n_01 = 0xffffffffffffffff;
      if (-1 < (long)uVar78) {
        __n_01 = uVar78;
      }
      __s_00 = (aiNode **)operator_new__(__n_01);
      memset(__s_00,0,__n_01);
      local_7d0->mChildren = __s_00;
      for (; ppaVar57 != iVar36._M_current; ppaVar57 = ppaVar57 + 1) {
        paVar60 = *ppaVar57;
        uVar68 = local_7d0->mNumChildren;
        local_7d0->mNumChildren = uVar68 + 1;
        local_7d0->mChildren[uVar68] = paVar60;
        paVar60->mParent = local_7d0;
      }
    }
    uVar78 = *(ulong *)((parent->mName).data + *(long *)(*(long *)&parent->mName + -0x18) + 4);
    __position._M_node = (_Base_ptr)&el[1].super_IfcObject.field_0x48;
    p_Var17 = *(_Base_ptr *)&el[1].super_IfcObject.field_0x50;
    p_Var67 = __position._M_node;
    for (p_Var14 = p_Var17; p_Var14 != (_Base_ptr)0x0;
        p_Var14 = (&p_Var14->_M_left)[*(ulong *)(p_Var14 + 1) < uVar78]) {
      if (*(ulong *)(p_Var14 + 1) >= uVar78) {
        p_Var67 = p_Var14;
      }
    }
    p_Var73 = __position._M_node;
    if ((p_Var67 != __position._M_node) && (p_Var73 = p_Var67, uVar78 < *(ulong *)(p_Var67 + 1))) {
      p_Var73 = __position._M_node;
    }
    p_Var67 = __position._M_node;
    if (p_Var73 == __position._M_node) {
      __assert_fail("conv.already_processed.find(el.GetID()) != conv.already_processed.end()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Importer/IFC/IFCLoader.cpp"
                    ,0x365,
                    "aiNode *(anonymous namespace)::ProcessSpatialStructure(aiNode *, const Schema_2x3::IfcProduct &, ConversionData &, std::vector<TempOpening> *)"
                   );
    }
    for (; p_Var17 != (_Base_ptr)0x0;
        p_Var17 = (&p_Var17->_M_left)[*(ulong *)(p_Var17 + 1) < uVar78]) {
      if (*(ulong *)(p_Var17 + 1) >= uVar78) {
        p_Var67 = p_Var17;
      }
    }
    if ((p_Var67 != __position._M_node) && (*(ulong *)(p_Var67 + 1) <= uVar78)) {
      __position._M_node = p_Var67;
    }
    std::
    _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
    ::erase_abi_cxx11_((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                        *)local_548,__position);
    if (local_758 != (aiNode **)0x0) {
      operator_delete(local_758);
    }
    std::vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>::~vector
              (&local_508);
  }
  return local_7d0;
}

Assistant:

aiNode* ProcessSpatialStructure(aiNode* parent, const Schema_2x3::IfcProduct& el, ConversionData& conv,
        std::vector<TempOpening>* collect_openings = nullptr ) {
    const STEP::DB::RefMap& refs = conv.db.GetRefs();

    // skip over space and annotation nodes - usually, these have no meaning in Assimp's context
    bool skipGeometry = false;
    if(conv.settings.skipSpaceRepresentations) {
        if(el.ToPtr<Schema_2x3::IfcSpace>()) {
            IFCImporter::LogDebug("skipping IfcSpace entity due to importer settings");
            skipGeometry = true;
        }
    }

    if(conv.settings.skipAnnotations) {
        if(el.ToPtr<Schema_2x3::IfcAnnotation>()) {
            IFCImporter::LogDebug("skipping IfcAnnotation entity due to importer settings");
            return nullptr;
        }
    }

    // add an output node for this spatial structure
    aiNode *nd(new aiNode );
    nd->mName.Set(el.GetClassName()+"_"+(el.Name?el.Name.Get():"Unnamed")+"_"+el.GlobalId);
    nd->mParent = parent;

    conv.already_processed.insert(el.GetID());

    // check for node metadata
    STEP::DB::RefMapRange children = refs.equal_range(el.GetID());
    if (children.first!=refs.end()) {
        Metadata properties;
        if (children.first==children.second) {
            // handles single property set
            ProcessMetadata((*children.first).second, conv, properties);
        } else {
            // handles multiple property sets (currently all property sets are merged,
            // which may not be the best solution in the long run)
            for (STEP::DB::RefMap::const_iterator it=children.first; it!=children.second; ++it) {
                ProcessMetadata((*it).second, conv, properties);
            }
        }

        if (!properties.empty()) {
            aiMetadata* data = aiMetadata::Alloc( static_cast<unsigned int>(properties.size()) );
            unsigned int index( 0 );
            for ( const Metadata::value_type& kv : properties ) {
                data->Set( index++, kv.first, aiString( kv.second ) );
            }
            nd->mMetaData = data;
        }
    }

    if(el.ObjectPlacement) {
        ResolveObjectPlacement(nd->mTransformation,el.ObjectPlacement.Get(),conv);
    }

    std::vector<TempOpening> openings;

    IfcMatrix4 myInv;
    bool didinv = false;

    // convert everything contained directly within this structure,
    // this may result in more nodes.
    std::vector< aiNode* > subnodes;
    try {
        // locate aggregates and 'contained-in-here'-elements of this spatial structure and add them in recursively
        // on our way, collect openings in *this* element
        STEP::DB::RefMapRange range = refs.equal_range(el.GetID());

        for(STEP::DB::RefMapRange range2 = range; range2.first != range.second; ++range2.first) {
            // skip over meshes that have already been processed before. This is strictly necessary
            // because the reverse indices also include references contained in argument lists and
            // therefore every element has a back-reference hold by its parent.
            if (conv.already_processed.find((*range2.first).second) != conv.already_processed.end()) {
                continue;
            }
            const STEP::LazyObject& obj = conv.db.MustGetObject((*range2.first).second);

            // handle regularly-contained elements
            if(const Schema_2x3::IfcRelContainedInSpatialStructure* const cont = obj->ToPtr<Schema_2x3::IfcRelContainedInSpatialStructure>()) {
                if(cont->RelatingStructure->GetID() != el.GetID()) {
                    continue;
                }
                for(const Schema_2x3::IfcProduct& pro : cont->RelatedElements) {
                    if(pro.ToPtr<Schema_2x3::IfcOpeningElement>()) {
                        // IfcOpeningElement is handled below. Sadly we can't use it here as is:
                        // The docs say that opening elements are USUALLY attached to building storey,
                        // but we want them for the building elements to which they belong.
                        continue;
                    }

                    aiNode* const ndnew = ProcessSpatialStructure(nd,pro,conv,nullptr);
                    if(ndnew) {
                        subnodes.push_back( ndnew );
                    }
                }
            }
            // handle openings, which we collect in a list rather than adding them to the node graph
            else if(const Schema_2x3::IfcRelVoidsElement* const fills = obj->ToPtr<Schema_2x3::IfcRelVoidsElement>()) {
                if(fills->RelatingBuildingElement->GetID() == el.GetID()) {
                    const Schema_2x3::IfcFeatureElementSubtraction& open = fills->RelatedOpeningElement;

                    // move opening elements to a separate node since they are semantically different than elements that are just 'contained'
                    std::unique_ptr<aiNode> nd_aggr(new aiNode());
                    nd_aggr->mName.Set("$RelVoidsElement");
                    nd_aggr->mParent = nd;

                    nd_aggr->mTransformation = nd->mTransformation;

                    std::vector<TempOpening> openings_local;
                    aiNode* const ndnew = ProcessSpatialStructure( nd_aggr.get(),open, conv,&openings_local);
                    if (ndnew) {

                        nd_aggr->mNumChildren = 1;
                        nd_aggr->mChildren = new aiNode*[1]();


                        nd_aggr->mChildren[0] = ndnew;

                        if(openings_local.size()) {
                            if (!didinv) {
                                myInv = aiMatrix4x4(nd->mTransformation ).Inverse();
                                didinv = true;
                            }

                            // we need all openings to be in the local space of *this* node, so transform them
                            for(TempOpening& op :openings_local) {
                                op.Transform( myInv*nd_aggr->mChildren[0]->mTransformation);
                                openings.push_back(op);
                            }
                        }
                        subnodes.push_back( nd_aggr.release() );
                    }
                }
            }
        }

        for(;range.first != range.second; ++range.first) {
            // see note in loop above
            if (conv.already_processed.find((*range.first).second) != conv.already_processed.end()) {
                continue;
            }
            if(const Schema_2x3::IfcRelAggregates* const aggr = conv.db.GetObject((*range.first).second)->ToPtr<Schema_2x3::IfcRelAggregates>()) {
                if(aggr->RelatingObject->GetID() != el.GetID()) {
                    continue;
                }

                // move aggregate elements to a separate node since they are semantically different than elements that are just 'contained'
                std::unique_ptr<aiNode> nd_aggr(new aiNode());
                nd_aggr->mName.Set("$RelAggregates");
                nd_aggr->mParent = nd;

                nd_aggr->mTransformation = nd->mTransformation;

                nd_aggr->mChildren = new aiNode*[aggr->RelatedObjects.size()]();
                for(const Schema_2x3::IfcObjectDefinition& def : aggr->RelatedObjects) {
                    if(const Schema_2x3::IfcProduct* const prod = def.ToPtr<Schema_2x3::IfcProduct>()) {

                        aiNode* const ndnew = ProcessSpatialStructure(nd_aggr.get(),*prod,conv,NULL);
                        if(ndnew) {
                            nd_aggr->mChildren[nd_aggr->mNumChildren++] = ndnew;
                        }
                    }
                }

                subnodes.push_back( nd_aggr.release() );
            }
        }

        conv.collect_openings = collect_openings;
        if(!conv.collect_openings) {
            conv.apply_openings = &openings;
        }

        if (!skipGeometry) {
          ProcessProductRepresentation(el, nd, subnodes, conv);
          conv.apply_openings = conv.collect_openings = nullptr;
        }

        if (subnodes.size()) {
            nd->mChildren = new aiNode*[subnodes.size()]();
            for(aiNode* nd2 : subnodes) {
                nd->mChildren[nd->mNumChildren++] = nd2;
                nd2->mParent = nd;
            }
        }
    } catch(...) {
        // it hurts, but I don't want to pull boost::ptr_vector into -noboost only for these few spots here
        std::for_each(subnodes.begin(),subnodes.end(),delete_fun<aiNode>());
        throw;
    }

    ai_assert(conv.already_processed.find(el.GetID()) != conv.already_processed.end());
    conv.already_processed.erase(conv.already_processed.find(el.GetID()));
    return nd;
}